

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int setup_boot_information(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  uint32_t uVar3;
  la_int64_t lVar4;
  int *piVar5;
  ssize_t sVar6;
  ssize_t rs;
  ssize_t i;
  size_t rsize;
  uchar buff [4096];
  size_t sStack_30;
  uint32_t sum;
  int64_t size;
  isoent *np;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  lVar2 = *(long *)((long)pvVar1 + 0x10340);
  lseek(*(int *)((long)pvVar1 + 8),*(long *)(*(long *)(lVar2 + 0x18) + 0x90) + 0x40,0);
  lVar4 = archive_entry_size(*(archive_entry **)(*(long *)(lVar2 + 0x18) + 0x20));
  sStack_30 = lVar4 + -0x40;
  if ((long)sStack_30 < 1) {
    piVar5 = __errno_location();
    archive_set_error(&a->archive,*piVar5,"Boot file(%jd) is too small",lVar4);
    a_local._4_4_ = -0x1e;
  }
  else {
    buff[0xffc] = '\0';
    buff[0xffd] = '\0';
    buff[0xffe] = '\0';
    buff[0xfff] = '\0';
    for (; 0 < (long)sStack_30; sStack_30 = sStack_30 - sVar6) {
      if ((long)sStack_30 < 0x1001) {
        i = sStack_30;
      }
      else {
        i = 0x1000;
      }
      sVar6 = read(*(int *)((long)pvVar1 + 8),&rsize,i);
      if (sVar6 < 1) {
        piVar5 = __errno_location();
        archive_set_error(&a->archive,*piVar5,"Can\'t read temporary file(%jd)",sVar6);
        return -0x1e;
      }
      for (rs = 0; rs < sVar6; rs = rs + 4) {
        uVar3 = archive_le32dec(buff + rs + -8);
        buff._4092_4_ = uVar3 + buff._4092_4_;
      }
    }
    set_num_731((uchar *)&rsize,0x10);
    set_num_731((uchar *)((long)&rsize + 4),*(uint32_t *)(*(long *)(lVar2 + 0x18) + 0xa4));
    sStack_30 = fd_boot_image_size((uint)*(byte *)((long)pvVar1 + 0x10368));
    if (sStack_30 == 0) {
      sStack_30 = archive_entry_size(*(archive_entry **)(*(long *)(lVar2 + 0x18) + 0x20));
    }
    set_num_731(buff,(uint32_t)sStack_30);
    set_num_731(buff + 4,buff._4092_4_);
    memset(buff + 8,0,0x28);
    lseek(*(int *)((long)pvVar1 + 8),*(long *)(*(long *)(lVar2 + 0x18) + 0x90) + 8,0);
    a_local._4_4_ = write_to_temp(a,&rsize,0x38);
  }
  return a_local._4_4_;
}

Assistant:

static int
setup_boot_information(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *np;
	int64_t size;
	uint32_t sum;
	unsigned char buff[4096];

	np = iso9660->el_torito.boot;
	lseek(iso9660->temp_fd,
	    np->file->content.offset_of_temp + 64, SEEK_SET);
	size = archive_entry_size(np->file->entry) - 64;
	if (size <= 0) {
		archive_set_error(&a->archive, errno,
		    "Boot file(%jd) is too small", (intmax_t)size + 64);
		return (ARCHIVE_FATAL);
	}
	sum = 0;
	while (size > 0) {
		size_t rsize;
		ssize_t i, rs;

		if (size > (int64_t)sizeof(buff))
			rsize = sizeof(buff);
		else
			rsize = (size_t)size;

		rs = read(iso9660->temp_fd, buff, rsize);
		if (rs <= 0) {
			archive_set_error(&a->archive, errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		for (i = 0; i < rs; i += 4)
			sum += archive_le32dec(buff + i);
		size -= rs;
	}
	/* Set the location of Primary Volume Descriptor. */
	set_num_731(buff, SYSTEM_AREA_BLOCK);
	/* Set the location of the boot file. */
	set_num_731(buff+4, np->file->content.location);
	/* Set the size of the boot file. */
	size = fd_boot_image_size(iso9660->el_torito.media_type);
	if (size == 0)
		size = archive_entry_size(np->file->entry);
	set_num_731(buff+8, (uint32_t)size);
	/* Set the sum of the boot file. */
	set_num_731(buff+12, sum);
	/* Clear reserved bytes. */
	memset(buff+16, 0, 40);

	/* Overwrite the boot file. */
	lseek(iso9660->temp_fd,
	    np->file->content.offset_of_temp + 8, SEEK_SET);
	return (write_to_temp(a, buff, 56));
}